

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall
VolumeFile::inflateDataIfNeeded
          (VolumeFile *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
          uint64_t outSize)

{
  uint uVar1;
  uint uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  size_type sVar3;
  ulong in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  unsigned_long headerSize;
  uint sizeComplement;
  uint magic;
  uchar *p;
  size_t in_stack_00000118;
  uint8_t *in_stack_00000120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000128;
  uchar **in_stack_ffffffffffffff90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa0;
  undefined4 local_20;
  undefined1 local_1;
  
  if (in_RDX < 0x100000000) {
    __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x133663);
    local_20 = (int)in_RDX;
    uVar1 = readNext<unsigned_int,unsigned_char>(in_stack_ffffffffffffff90);
    uVar2 = readNext<unsigned_int,unsigned_char>(in_stack_ffffffffffffff90);
    if ((uVar1 == 0xfff7eec5) && (local_20 + uVar2 == 0)) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
      if (sVar3 < 8) {
        local_1 = false;
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1336d5);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
        FileExpand::inflate(in_stack_00000128,in_stack_00000120,in_stack_00000118);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                  (in_stack_ffffffffffffffa0,__x);
        local_1 = true;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  (in_stack_ffffffffffffffa0);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VolumeFile::inflateDataIfNeeded(std::vector<uint8_t>& in, uint64_t outSize) const {
	if (outSize > UINT32_MAX)
		return false;

	const auto* p = in.data();

	// XXX: inflated data use little-endian always.
	const auto magic = readNext<uint32_t>(p);
	const auto sizeComplement = readNext<uint32_t>(p);

	if (magic != Z_MAGIC || (static_cast<uint32_t>(outSize) + sizeComplement) != 0) { // not compressed?
		return false;
	}

	const auto headerSize = sizeof(magic) + sizeof(sizeComplement);
	if (in.size() < headerSize) {
		return false;
	}

	std::vector<uint8_t> out;
	FileExpand::inflate(out, p, in.size() - headerSize);
	in.swap(out);

	return true;
}